

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void Qiniu_Region_Set_Io_Src_Preferred_Hosts
               (Qiniu_Region *region,char **hosts,size_t hostsCount,Qiniu_Bool useHttps)

{
  _Qiniu_Region_Service *p_Var1;
  _Qiniu_Region_Service *p_Var2;
  _Qiniu_Region_Service *oldIoSrcService;
  Qiniu_Bool useHttps_local;
  size_t hostsCount_local;
  char **hosts_local;
  Qiniu_Region *region_local;
  
  if (region != (Qiniu_Region *)0x0) {
    if (region->ioSrcService == (_Qiniu_Region_Service *)0x0) {
      p_Var2 = _Qiniu_Region_Service_New((char **)0x0,0,hosts,hostsCount,(char **)0x0,0,useHttps);
      region->ioSrcService = p_Var2;
    }
    else {
      p_Var2 = region->ioSrcService;
      p_Var1 = _Qiniu_Region_Service_New
                         (p_Var2->hosts,p_Var2->acceleratedHostsCount,hosts,hostsCount,
                          p_Var2->hosts +
                          p_Var2->acceleratedHostsCount + p_Var2->preferredHostsCount,
                          p_Var2->alternativeHostsCount,useHttps);
      region->ioSrcService = p_Var1;
      _Qiniu_Region_Service_Free(p_Var2);
    }
  }
  return;
}

Assistant:

void Qiniu_Region_Set_Io_Src_Preferred_Hosts(Qiniu_Region *region, const char *const *hosts, size_t hostsCount, Qiniu_Bool useHttps)
{
    if (region == NULL)
    {
        return;
    }
    if (region->ioSrcService != NULL)
    {
        struct _Qiniu_Region_Service *oldIoSrcService = region->ioSrcService;
        region->ioSrcService = _Qiniu_Region_Service_New(
            oldIoSrcService->hosts, oldIoSrcService->acceleratedHostsCount,
            hosts, hostsCount,
            oldIoSrcService->hosts + oldIoSrcService->acceleratedHostsCount + oldIoSrcService->preferredHostsCount, oldIoSrcService->alternativeHostsCount,
            useHttps);
        _Qiniu_Region_Service_Free(oldIoSrcService);
    }
    else
    {
        region->ioSrcService = _Qiniu_Region_Service_New(NULL, 0, hosts, hostsCount, NULL, 0, useHttps);
    }
}